

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.hh
# Opt level: O0

field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
* __thiscall
discordpp::
field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
::operator=(field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
            *this,field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
                  *f)

{
  bool bVar1;
  type __rhs;
  pointer local_58;
  field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
  *f_local;
  field<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>
  *this_local;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)f);
  if (bVar1) {
    local_58 = (pointer)operator_new(0x128);
    __rhs = std::
            unique_ptr<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>,_std::default_delete<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>_>
            ::operator*(&f->t_);
    std::
    variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>
    ::variant(local_58,__rhs);
  }
  else {
    local_58 = (pointer)0x0;
  }
  std::
  unique_ptr<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>,_std::default_delete<std::variant<discordpp::ApplicationCommandData,_discordpp::MessageComponentData,_discordpp::ModalSubmitData>_>_>
  ::reset(&this->t_,local_58);
  this->s_ = present_e;
  return this;
}

Assistant:

field<T> &operator=(const field<T> &f) {
        t_.reset(f.t_ ? new T(*f.t_) : nullptr);
        s_ = present_e;
        return *this;
    }